

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporalPhaseDecodingSynapse.cpp
# Opt level: O2

void __thiscall
TemporalPhaseDecodingSynapse::initialize
          (TemporalPhaseDecodingSynapse *this,Population *n_from,Population *n_to)

{
  double *__ptr;
  Index IVar1;
  TemporalPhaseDecodingSynapse_param *pTVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  Clock *pCVar6;
  Logging *pLVar7;
  NoEvent *this_00;
  ostream *poVar8;
  undefined8 *puVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Matrix<double,__1,_1,_0,__1,_1> local_40;
  
  iVar5 = (*n_from->_vptr_Population[1])(n_from);
  this->inputSize = iVar5;
  iVar5 = (*n_to->_vptr_Population[1])(n_to);
  this->outputSize = iVar5;
  if (this->inputSize == iVar5) {
    (this->super_Synapse).from_population = n_from;
    (this->super_Synapse).to_population = n_to;
    pCVar6 = Clock::getInstance();
    this->clock = pCVar6;
    pLVar7 = Logging::getInstance();
    this->logger = pLVar7;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_40,&this->inputSize);
    __ptr = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
    (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    IVar1 = (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (this->spikeTimes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = __ptr
    ;
    local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1
    ;
    free(__ptr);
    local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0xbff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->spikeTimes,
               (Scalar *)&local_40);
    pTVar2 = this->param;
    iVar5 = pTVar2->som_frequency;
    dVar3 = pTVar2->som_phase;
    dVar4 = pTVar2->window_length_s;
    this->currentWindow = dVar4 + pTVar2->delay_s;
    auVar10._8_8_ = dVar3;
    auVar10._0_8_ = dVar4;
    auVar11._8_8_ = (double)iVar5 * 6.283185307179586;
    auVar11._0_8_ = (double)iVar5;
    auVar11 = divpd(auVar10,auVar11);
    this->phaseStep = (double)auVar11._0_8_;
    this->phaseOffset = (double)auVar11._8_8_;
    for (iVar5 = 0; iVar5 < this->inputSize; iVar5 = iVar5 + 1) {
      this_00 = (NoEvent *)operator_new(0x18);
      NoEvent::NoEvent(this_00);
      local_40.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)this_00;
      std::vector<Event*,std::allocator<Event*>>::emplace_back<Event*>
                ((vector<Event*,std::allocator<Event*>> *)&this->output,(Event **)&local_40);
    }
    return;
  }
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "Number of input neurons not equal to number of output neurons");
  std::endl<char,std::char_traits<char>>(poVar8);
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = "Number of input neurons not equal to number of output neurons";
  __cxa_throw(puVar9,&char_const*::typeinfo,0);
}

Assistant:

void TemporalPhaseDecodingSynapse::initialize(Population* n_from, Population* n_to) {
    inputSize = n_from->getNumberOfNeurons();
    outputSize = n_to->getNumberOfNeurons();
    if(inputSize != outputSize) {
        cout << "Number of input neurons not equal to number of output neurons" << endl;
        throw "Number of input neurons not equal to number of output neurons";
    }
    from_population = n_from;
    to_population = n_to;
    clock = Clock::getInstance();
    logger = Logging::getInstance();
    spikeTimes = Eigen::VectorXd(inputSize);
    spikeTimes.setConstant(-1);
    currentWindow = param->window_length_s + param->delay_s;
    phaseStep = param->window_length_s / param->som_frequency;
    phaseOffset = (param->som_phase * 1.0) / (2 * M_PI * param->som_frequency);
    for(int i = 0; i < inputSize; i++) {
        output.push_back(new NoEvent());
    }
}